

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall
Catch::Matchers::StringContainsMatcher::match(StringContainsMatcher *this,string *source)

{
  byte bVar1;
  string *in_RDI;
  string *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  string local_30 [48];
  
  CasedString::adjustString
            ((CasedString *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),in_RDI);
  bVar1 = contains(in_RDI,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_30);
  return (bool)(bVar1 & 1);
}

Assistant:

bool StringContainsMatcher::match( std::string const& source ) const {
        return contains( m_comparator.adjustString( source ), m_comparator.m_str );
    }